

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::FillRuleTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FillRuleTestInstance *this)

{
  pointer *this_00;
  deUint32 width;
  RGBA RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TestContext *pTVar6;
  TestLog *pTVar7;
  TextureFormat *format;
  int *piVar8;
  size_type __n;
  MessageBuilder *pMVar9;
  int iVar10;
  allocator<char> local_dc1;
  string local_dc0;
  undefined4 local_da0;
  allocator<char> local_d99;
  string local_d98;
  allocator<char> local_d71;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  LogImage local_d28;
  allocator<char> local_c91;
  string local_c90;
  allocator<char> local_c69;
  string local_c68;
  LogImageSet local_c48;
  MessageBuilder local_c08;
  MessageBuilder local_a88;
  RGBA local_904;
  int local_900;
  RGBA color_1;
  int x_1;
  int y_1;
  byte local_771;
  undefined1 local_770 [7];
  bool missingFragments;
  MessageBuilder local_5f0;
  RGBA local_46c;
  int local_468;
  RGBA color;
  int x;
  int y;
  byte local_2dd;
  RGBA local_2dc;
  undefined1 local_2d8 [3];
  bool overdraw;
  RGBA triangleColor;
  allocator<tcu::Vector<float,_4>_> local_151;
  Vector<float,_4> local_150;
  undefined1 local_140 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  int thresholdBlue;
  int thresholdGreen;
  int thresholdRed;
  IVec4 colorBits;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  FillRuleTestInstance *this_local;
  
  local_9c = this->m_iteration + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar6 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)(colorBits.m_data + 2),pTVar7,(string *)local_38,(string *)local_38
            );
  format = BaseRenderingTestInstance::getTextureFormat(&this->super_BaseRenderingTestInstance);
  tcu::getTextureFormatBitDepth((tcu *)&thresholdGreen,format);
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&thresholdGreen,0);
  iVar2 = 1 << (8U - (char)*piVar8 & 0x1f);
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&thresholdGreen,1);
  iVar3 = 1 << (8U - (char)*piVar8 & 0x1f);
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&thresholdGreen,2);
  iVar10 = 1 << (8U - (char)*piVar8 & 0x1f);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,width,width);
  this_00 = &colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00);
  generateTriangles(this,this->m_iteration,
                    (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    this_00);
  __n = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &colorBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Vector<float,_4>::Vector(&local_150,0.5,0.5,0.5,1.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_151);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140,__n
             ,&local_150,&local_151);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_151);
  pTVar6 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_2d8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_2d8,
                      (char (*) [102])
                      "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
                     );
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2d8);
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,
             (Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140);
  tcu::RGBA::RGBA(&local_2dc,0x7f,0x7f,0x7f,0xff);
  local_2dd = 0;
  pTVar6 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  tcu::TestLog::operator<<((MessageBuilder *)&x,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)&x,(char (*) [18])"Verifying result.");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
  color.m_value = 0;
  do {
    RVar1.m_value = color.m_value;
    iVar4 = tcu::Surface::getHeight
                      ((Surface *)
                       &drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar4 <= (int)RVar1.m_value) {
      if ((local_2dd & 1) == 0) {
        pTVar6 = Context::getTestContext
                           ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<(&local_5f0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_5f0,(char (*) [35])"No overlapping fragments detected.");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5f0);
      }
      else {
        pTVar6 = Context::getTestContext
                           ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_770,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_770,
                            (char (*) [52])"Overlapping fragments detected, image is not valid.");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_770);
        this->m_allIterationsPassed = false;
      }
      if (this->m_caseType == FILLRULECASE_CLIPPED_FULL) {
        local_771 = 0;
        pTVar6 = Context::getTestContext
                           ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&x_1,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&x_1,(char (*) [29])"Searching missing fragments.");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x_1);
        for (color_1.m_value = 0; RVar1.m_value = color_1.m_value,
            iVar4 = tcu::Surface::getHeight
                              ((Surface *)
                               &drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage),
            (int)RVar1.m_value < iVar4; color_1.m_value = color_1.m_value + 1) {
          for (local_900 = 0; iVar4 = local_900,
              iVar5 = tcu::Surface::getWidth
                                ((Surface *)
                                 &drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar4 < iVar5
              ; local_900 = local_900 + 1) {
            local_904 = tcu::Surface::getPixel
                                  ((Surface *)
                                   &drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_900,
                                   color_1.m_value);
            iVar4 = tcu::RGBA::getRed(&local_904);
            if (((iVar4 <= iVar2) || (iVar4 = tcu::RGBA::getGreen(&local_904), iVar4 <= iVar3)) ||
               (iVar4 = tcu::RGBA::getBlue(&local_904), iVar4 <= iVar10)) {
              local_771 = 1;
            }
          }
        }
        if ((local_771 & 1) == 0) {
          pTVar6 = Context::getTestContext
                             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
          pTVar7 = tcu::TestContext::getLog(pTVar6);
          tcu::TestLog::operator<<(&local_a88,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_a88,(char (*) [31])"No missing fragments detected.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_a88);
        }
        else {
          pTVar6 = Context::getTestContext
                             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
          pTVar7 = tcu::TestContext::getLog(pTVar6);
          tcu::TestLog::operator<<(&local_c08,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_c08,
                              (char (*) [48])"Missing fragments detected, image is not valid.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_c08);
          this->m_allIterationsPassed = false;
        }
      }
      pTVar6 = Context::getTestContext
                         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
      pTVar7 = tcu::TestContext::getLog(pTVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c68,"Result of rendering",&local_c69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c90,"Result of rendering",&local_c91);
      tcu::LogImageSet::LogImageSet(&local_c48,&local_c68,&local_c90);
      pTVar7 = tcu::TestLog::operator<<(pTVar7,&local_c48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,"Result",&local_d49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d70,"Result",&local_d71);
      tcu::LogImage::LogImage
                (&local_d28,&local_d48,&local_d70,
                 (Surface *)
                 &drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      pTVar7 = tcu::TestLog::operator<<(pTVar7,&local_d28);
      tcu::TestLog::operator<<(pTVar7,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_d28);
      std::__cxx11::string::~string((string *)&local_d70);
      std::allocator<char>::~allocator(&local_d71);
      std::__cxx11::string::~string((string *)&local_d48);
      std::allocator<char>::~allocator(&local_d49);
      tcu::LogImageSet::~LogImageSet(&local_c48);
      std::__cxx11::string::~string((string *)&local_c90);
      std::allocator<char>::~allocator(&local_c91);
      std::__cxx11::string::~string((string *)&local_c68);
      std::allocator<char>::~allocator(&local_c69);
      iVar2 = this->m_iteration + 1;
      this->m_iteration = iVar2;
      if (iVar2 == this->m_iterationCount) {
        if ((this->m_allIterationsPassed & 1U) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_dc0,"Found invalid pixels",&local_dc1);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_dc0);
          std::__cxx11::string::~string((string *)&local_dc0);
          std::allocator<char>::~allocator(&local_dc1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d98,"Pass",&local_d99)
          ;
          tcu::TestStatus::pass(__return_storage_ptr__,&local_d98);
          std::__cxx11::string::~string((string *)&local_d98);
          std::allocator<char>::~allocator(&local_d99);
        }
      }
      else {
        tcu::TestStatus::incomplete();
      }
      local_da0 = 1;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &colorBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::Surface::~Surface
                ((Surface *)
                 &drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)(colorBits.m_data + 2));
      std::__cxx11::string::~string((string *)local_38);
      return __return_storage_ptr__;
    }
    for (local_468 = 0; iVar4 = local_468,
        iVar5 = tcu::Surface::getWidth
                          ((Surface *)
                           &drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar4 < iVar5;
        local_468 = local_468 + 1) {
      local_46c = tcu::Surface::getPixel
                            ((Surface *)
                             &drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_468,
                             color.m_value);
      iVar4 = tcu::RGBA::getRed(&local_46c);
      iVar5 = tcu::RGBA::getRed(&local_2dc);
      if (iVar2 < iVar4 - iVar5) {
LAB_00e1c08a:
        local_2dd = 1;
      }
      else {
        iVar4 = tcu::RGBA::getGreen(&local_46c);
        iVar5 = tcu::RGBA::getGreen(&local_2dc);
        if (iVar3 < iVar4 - iVar5) goto LAB_00e1c08a;
        iVar4 = tcu::RGBA::getBlue(&local_46c);
        iVar5 = tcu::RGBA::getBlue(&local_2dc);
        if (iVar10 < iVar4 - iVar5) goto LAB_00e1c08a;
      }
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

tcu::TestStatus FillRuleTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	tcu::IVec4								colorBits				= tcu::getTextureFormatBitDepth(getTextureFormat());
	const int								thresholdRed			= 1 << (8 - colorBits[0]);
	const int								thresholdGreen			= 1 << (8 - colorBits[1]);
	const int								thresholdBlue			= 1 << (8 - colorBits[2]);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, colorBuffer, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			m_allIterationsPassed = false;
		}
	}

	m_context.getTestContext().getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
										<< tcu::TestLog::Image("Result", "Result", resultImage)
										<< tcu::TestLog::EndImageSet;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Found invalid pixels");
	}
	else
		return tcu::TestStatus::incomplete();
}